

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Visualizer.cpp
# Opt level: O1

void __thiscall iDynTree::Visualizer::VisualizerPimpl::VisualizerPimpl(VisualizerPimpl *this)

{
  (this->m_invalidModelViz).super_IModelVisualization._vptr_IModelVisualization =
       (_func_int **)&PTR__DummyModelVisualization_0010c760;
  iDynTree::Model::Model(&(this->m_invalidModelViz).m_dummyModel);
  (this->m_invalidModelViz).m_dummyJets.super_IJetsVisualization._vptr_IJetsVisualization =
       (_func_int **)&PTR__IJetsVisualization_0010c868;
  (this->m_invalidModelViz).m_dummyLabel.super_ILabel._vptr_ILabel =
       (_func_int **)&PTR__ILabel_0010ccc8;
  (this->m_camera).super_ICamera._vptr_ICamera = (_func_int **)&PTR__ICamera_0010c8e8;
  (this->m_environment).super_IEnvironment._vptr_IEnvironment =
       (_func_int **)&PTR__DummyEnvironment_0010c960;
  DummyLight::DummyLight(&(this->m_environment).m_dummyLight);
  (this->m_invalidVectors).super_IVectorsVisualization._vptr_IVectorsVisualization =
       (_func_int **)&PTR__IVectorsVisualization_0010caa0;
  (this->m_invalidFrames).super_IFrameVisualization._vptr_IFrameVisualization =
       (_func_int **)&PTR__IFrameVisualization_0010cb50;
  (this->m_invalidTextures).super_ITexturesHandler._vptr_ITexturesHandler =
       (_func_int **)&PTR__ITexturesHandler_0010cbd8;
  (this->m_invalidShapes).super_IShapeVisualization._vptr_IShapeVisualization =
       (_func_int **)&PTR__IShapeVisualization_0010cc30;
  (this->m_invalidLabel).super_ILabel._vptr_ILabel = (_func_int **)&PTR__ILabel_0010ccc8;
  this->m_isInitialized = false;
  this->lastFPS = -1;
  return;
}

Assistant:

VisualizerPimpl()
    {
        m_isInitialized = false;
        lastFPS = -1;

#ifdef IDYNTREE_USES_IRRLICHT
        m_modelViz = std::make_shared<std::vector<ModelVisualization*>>();
        m_modelViz->resize(0);
        m_irrDevice  = 0;
        m_irrSmgr    = 0;
        m_irrDriver  = 0;
#endif
    }